

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

ssize_t __thiscall
hwnet::TCPSocket::_send(TCPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  linklist *this_00;
  bool bVar1;
  undefined7 extraout_var;
  sendContext *s;
  undefined7 extraout_var_00;
  TCPSocket *pTVar2;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  bool *post_local;
  bool closedOnFlush__local;
  size_t len_local;
  Ptr *buff_local;
  TCPSocket *this_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  pTVar2 = (TCPSocket *)CONCAT71(extraout_var,bVar1);
  if (((!bVar1) && (pTVar2 = this, (this->shutdown & 1U) == 0)) && ((this->closedOnFlush & 1U) == 0)
     ) {
    this->closedOnFlush = (bool)((byte)__n & 1);
    this_00 = this->ptrSendlist;
    s = getSendContext(this->fd,(Ptr *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    linklist::push_back(this_00,s);
    this->bytes4Send = (long)__buf + this->bytes4Send;
    if (this->sendTimeout != 0) {
      registerTimer(this,1);
    }
    if ((this->doing & 1U) == 0) {
      if ((this->writeable & 1U) == 0) {
        bVar1 = highWater(this);
        if (!bVar1) {
          return CONCAT71(extraout_var_00,bVar1);
        }
      }
      this->doing = true;
      *(undefined1 *)&(((TCPSocket *)CONCAT44(in_register_00000084,__flags))->super_Task)._vptr_Task
           = 1;
      pTVar2 = (TCPSocket *)CONCAT44(in_register_00000084,__flags);
    }
  }
  return (ssize_t)pTVar2;
}

Assistant:

void TCPSocket::_send(const Buffer::Ptr &buff,size_t len,bool closedOnFlush_,bool &post) {
	if(this->closed || this->shutdown || this->closedOnFlush) {
		return;
	}

	this->closedOnFlush = closedOnFlush_;

	this->ptrSendlist->push_back(getSendContext(this->fd,buff,len));
	this->bytes4Send += len;

	if(this->sendTimeout > 0) {
		this->registerTimer(timerSend);
	}

	if(!this->doing && (this->writeable || this->highWater())) {
		this->doing = true;
		post = true;
	}	
}